

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O0

void highwayhash::PinThreadToCPU(int cpu)

{
  ulong uVar1;
  size_t __cpu;
  ThreadAffinity affinity;
  int cpu_local;
  
  affinity.set.__bits[0xf]._4_4_ = cpu;
  memset(&__cpu,0,0x80);
  if ((ulong)(long)affinity.set.__bits[0xf]._4_4_ >> 3 < 0x80) {
    uVar1 = (ulong)(long)affinity.set.__bits[0xf]._4_4_ >> 6;
    affinity.set.__bits[uVar1 - 1] =
         1L << ((byte)affinity.set.__bits[0xf]._4_4_ & 0x3f) | affinity.set.__bits[uVar1 - 1];
  }
  SetThreadAffinity((ThreadAffinity *)&__cpu);
  return;
}

Assistant:

void PinThreadToCPU(const int cpu) {
  ThreadAffinity affinity;
#if OS_WIN
  affinity.mask = 1ULL << cpu;
#elif OS_LINUX
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#elif OS_FREEBSD
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#elif OS_MAC
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#else
#error "port"
#endif
  SetThreadAffinity(&affinity);
}